

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_node.cpp
# Opt level: O1

fe_im * get_image(fe_im *__return_storage_ptr__,fe_node *node,fe_args *args)

{
  free_image_fn *pp_Var1;
  uint8_t **ppuVar2;
  float fVar3;
  int iVar4;
  uint8_t *puVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  FE_IMAGE_FORMAT FVar9;
  undefined4 uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  fe_im_cache *pfVar15;
  
  pfVar15 = (args->cache).images;
  if ((pfVar15 == (fe_im_cache *)0x0) || (pfVar15[node->index].image.image.data == (uint8_t *)0x0))
  {
    (*node->get_image)(__return_storage_ptr__,node,args);
    fVar3 = args->scale;
    __return_storage_ptr__->x = __return_storage_ptr__->x + (int)((float)node->x * fVar3);
    __return_storage_ptr__->y = __return_storage_ptr__->y + (int)((float)node->y * fVar3);
    if (pfVar15 == (fe_im_cache *)0x0) {
      return __return_storage_ptr__;
    }
    iVar4 = node->index;
    iVar8 = (__return_storage_ptr__->image).w;
    iVar11 = (__return_storage_ptr__->image).h;
    iVar12 = (__return_storage_ptr__->image).pitch;
    iVar13 = (__return_storage_ptr__->image).bytespp;
    puVar5 = (__return_storage_ptr__->image).data;
    uVar6 = *(undefined8 *)&(__return_storage_ptr__->image).format;
    uVar7 = *(undefined8 *)&__return_storage_ptr__->x;
    pp_Var1 = &pfVar15[iVar4].image.image.free;
    *pp_Var1 = (__return_storage_ptr__->image).free;
    pp_Var1[1] = (free_image_fn)uVar7;
    ppuVar2 = &pfVar15[iVar4].image.image.data;
    *ppuVar2 = puVar5;
    ppuVar2[1] = (uint8_t *)uVar6;
    pfVar15 = pfVar15 + iVar4;
    (pfVar15->image).image.w = iVar8;
    (pfVar15->image).image.h = iVar11;
    (pfVar15->image).image.pitch = iVar12;
    (pfVar15->image).image.bytespp = iVar13;
  }
  else {
    pfVar15 = pfVar15 + node->index;
    iVar11 = (pfVar15->image).image.w;
    iVar12 = (pfVar15->image).image.h;
    iVar13 = (pfVar15->image).image.pitch;
    iVar14 = (pfVar15->image).image.bytespp;
    puVar5 = (pfVar15->image).image.data;
    FVar9 = (pfVar15->image).image.format;
    uVar10 = *(undefined4 *)&(pfVar15->image).image.field_0x1c;
    iVar4 = (pfVar15->image).x;
    iVar8 = (pfVar15->image).y;
    (__return_storage_ptr__->image).free = (pfVar15->image).image.free;
    __return_storage_ptr__->x = iVar4;
    __return_storage_ptr__->y = iVar8;
    (__return_storage_ptr__->image).data = puVar5;
    (__return_storage_ptr__->image).format = FVar9;
    *(undefined4 *)&(__return_storage_ptr__->image).field_0x1c = uVar10;
    (__return_storage_ptr__->image).w = iVar11;
    (__return_storage_ptr__->image).h = iVar12;
    (__return_storage_ptr__->image).pitch = iVar13;
    (__return_storage_ptr__->image).bytespp = iVar14;
  }
  (__return_storage_ptr__->image).free = (free_image_fn)0x0;
  return __return_storage_ptr__;
}

Assistant:

fe_im get_image(const fe_node* node, const fe_args* args)
{
    fe_im_cache *cached = args->cache.images;
    if (cached && cached[node->index].image.image.data)
    {
        fe_im res = cached[node->index].image;
        res.image.free = 0;
        return res;
    }
    

    fe_im r = node->get_image(node, args);

    r.x += static_cast<int>(node->x * args->scale);
    r.y += static_cast<int>(node->y * args->scale);

#ifdef SAVE_NODES
    char str[255];
    sprintf(str, "../temp/%d.tga", node->id);
    fe_image_save_tga(&r.image, str);
#endif

    if (cached)
    {
        cached[node->index].image = r;
        r.image.free = 0;
    }

    return r;
}